

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubcommandTable.cxx
# Opt level: O3

void __thiscall
cmSubcommandTable::cmSubcommandTable
          (cmSubcommandTable *this,
          initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
          init)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>_>
  __i;
  pointer ppVar5;
  allocator_type local_19;
  
  std::
  vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>
  ::
  vector<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>const*,void>
            ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>
              *)this,init._M_array,init._M_array + init._M_len,&local_19);
  ppVar1 = (this->Impl).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->Impl).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    uVar4 = ((long)ppVar2 - (long)ppVar1 >> 3) * -0x5555555555555555;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmSubcommandTable::cmSubcommandTable(std::initializer_list<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>)::__0>>
              (ppVar1,ppVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar2 - (long)ppVar1 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmSubcommandTable::cmSubcommandTable(std::initializer_list<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>)::__0>>
                (ppVar1,ppVar2);
    }
    else {
      ppVar5 = ppVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmSubcommandTable::cmSubcommandTable(std::initializer_list<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>)::__0>>
                (ppVar1,ppVar5);
      for (; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>>,__gnu_cxx::__ops::_Val_comp_iter<cmSubcommandTable::cmSubcommandTable(std::initializer_list<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>)::__0>>
                  (ppVar5);
      }
    }
  }
  return;
}

Assistant:

cmSubcommandTable::cmSubcommandTable(std::initializer_list<InitElem> init)
  : Impl(init.begin(), init.end())
{
  std::sort(this->Impl.begin(), this->Impl.end(),
            [](Elem const& left, Elem const& right) {
              return left.first < right.first;
            });
}